

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O1

Action __thiscall
psy::C::DeclarationBinder::visitArrayOrFunctionDeclarator
          (DeclarationBinder *this,ArrayOrFunctionDeclaratorSyntax *node)

{
  iterator *piVar1;
  _Elt_pointer ppTVar2;
  _Elt_pointer ppFVar3;
  Action AVar4;
  TypeKind TVar5;
  SyntaxKind SVar6;
  _Elt_pointer ppTVar7;
  Type *pTVar8;
  ostream *poVar9;
  _Elt_pointer ppTVar10;
  int iVar11;
  SyntaxToken *__return_storage_ptr__;
  SpecifierListSyntax *pSVar12;
  FunctionType *funcTy;
  Type *local_a8;
  SyntaxToken local_a0;
  SyntaxToken local_68;
  
  for (pSVar12 = node->attrs1_; pSVar12 != (SpecifierListSyntax *)0x0;
      pSVar12 = (pSVar12->
                super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                ).
                super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                .next) {
    AVar4 = SyntaxVisitor::visit
                      (&this->super_SyntaxVisitor,
                       &((pSVar12->
                         super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                         ).
                         super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                        .value)->super_SyntaxNode);
    if (AVar4 == Quit) {
      return Quit;
    }
  }
  SVar6 = SyntaxNode::kind(&node->suffix_->super_SyntaxNode);
  if (SVar6 == ParameterSuffix) {
    ppTVar7 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar7 !=
        (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      ppTVar2 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first;
      ppTVar10 = ppTVar7;
      if (ppTVar7 == ppTVar2) {
        ppTVar10 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      if (ppTVar10[-1] != (Type *)0x0) {
        if (ppTVar7 == ppTVar2) {
          ppTVar7 = (this->tys_).c.
                    super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        pTVar8 = ppTVar7[-1];
        TVar5 = Type::kind(pTVar8);
        if (TVar5 == Array) {
          __return_storage_ptr__ = &local_a0;
          SyntaxNode::firstToken(__return_storage_ptr__,&node->innerDecltor_->super_SyntaxNode);
          DiagnosticsReporter::FunctionReturningArray(&this->diagReporter_,__return_storage_ptr__);
        }
        else {
          if (TVar5 == Error) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"[ASSERT] at ",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x114);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<empty message>",0xf);
            std::endl<char,std::char_traits<char>>(poVar9);
            return Quit;
          }
          if (TVar5 != Function) goto LAB_002e1844;
          __return_storage_ptr__ = &local_68;
          SyntaxNode::firstToken(__return_storage_ptr__,&node->innerDecltor_->super_SyntaxNode);
          DiagnosticsReporter::FunctionReturningFunction
                    (&this->diagReporter_,__return_storage_ptr__);
        }
        SyntaxToken::~SyntaxToken(__return_storage_ptr__);
LAB_002e1844:
        local_a8 = &makeType<psy::C::FunctionType,psy::C::Type*>(this,pTVar8)->super_Type;
        pushType(this,local_a8);
        ppFVar3 = (this->pendingFuncTys_).c.
                  super__Deque_base<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppFVar3 ==
            (this->pendingFuncTys_).c.
            super__Deque_base<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<psy::C::FunctionType*,std::allocator<psy::C::FunctionType*>>::
          _M_push_back_aux<psy::C::FunctionType*const&>
                    ((deque<psy::C::FunctionType*,std::allocator<psy::C::FunctionType*>> *)
                     &this->pendingFuncTys_,(FunctionType **)&local_a8);
        }
        else {
          *ppFVar3 = (FunctionType *)local_a8;
          piVar1 = &(this->pendingFuncTys_).c.
                    super__Deque_base<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        AVar4 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,&node->innerDecltor_->super_SyntaxNode);
        if (AVar4 == Quit) {
          return Quit;
        }
        for (pSVar12 = node->attrs2_; pSVar12 != (SpecifierListSyntax *)0x0;
            pSVar12 = (pSVar12->
                      super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                      ).
                      super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                      .next) {
          AVar4 = SyntaxVisitor::visit
                            (&this->super_SyntaxVisitor,
                             &((pSVar12->
                               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                               ).
                               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                              .value)->super_SyntaxNode);
          if (AVar4 == Quit) {
            return Quit;
          }
        }
        AVar4 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
        if (AVar4 != Quit) {
          pushNewScope(this,(SyntaxNode *)node,FunctionPrototype,true);
          AVar4 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->suffix_->super_SyntaxNode);
          if (AVar4 != Quit) {
            popAndStashScope(this);
            std::deque<psy::C::FunctionType_*,_std::allocator<psy::C::FunctionType_*>_>::pop_back
                      (&(this->pendingFuncTys_).c);
            return Skip;
          }
          return Quit;
        }
        return Quit;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar11 = 0xff;
  }
  else if (SVar6 == SubscriptSuffix) {
    ppTVar7 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppTVar7 !=
        (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      ppTVar2 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first;
      ppTVar10 = ppTVar7;
      if (ppTVar7 == ppTVar2) {
        ppTVar10 = (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      if (ppTVar10[-1] != (Type *)0x0) {
        if (ppTVar7 == ppTVar2) {
          ppTVar7 = (this->tys_).c.
                    super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        pTVar8 = &makeType<psy::C::ArrayType,psy::C::Type*>(this,ppTVar7[-1])->super_Type;
        pushType(this,pTVar8);
        AVar4 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,&node->innerDecltor_->super_SyntaxNode);
        if (AVar4 != Quit) {
          pSVar12 = node->attrs2_;
          while( true ) {
            if (pSVar12 == (SpecifierListSyntax *)0x0) {
              AVar4 = SyntaxVisitor::visit
                                (&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
              return (AVar4 == Quit) + Skip;
            }
            AVar4 = SyntaxVisitor::visit
                              (&this->super_SyntaxVisitor,
                               &((pSVar12->
                                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                                 ).
                                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                                .value)->super_SyntaxNode);
            if (AVar4 == Quit) break;
            pSVar12 = (pSVar12->
                      super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                      ).
                      super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                      .next;
          }
          return Quit;
        }
        return Quit;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar11 = 0xf6;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Declarators.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar11 = 0x127;
  }
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<empty message>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitArrayOrFunctionDeclarator(const ArrayOrFunctionDeclaratorSyntax* node)
{
    VISIT(node->attributes());

    switch (node->suffix()->kind()) {
        case SyntaxKind::SubscriptSuffix: {
            TY_AT_TOP(auto ty, Action::Quit);
            pushType(makeType<ArrayType>(ty));
            VISIT(node->innerDeclarator());
            VISIT(node->attributes_PostDeclarator());
            VISIT(node->initializer());
            return Action::Skip;
        }

        case SyntaxKind::ParameterSuffix: {
            TY_AT_TOP(auto ty, Action::Quit);
            switch (ty->kind()) {
                case TypeKind::Function:
                    diagReporter_.FunctionReturningFunction(
                                node->innerDeclarator()->firstToken());
                    break;

                case TypeKind::Array:
                    diagReporter_.FunctionReturningArray(
                                node->innerDeclarator()->firstToken());
                    break;

                case TypeKind::Pointer:
                case TypeKind::Basic:
                case TypeKind::Void:
                case TypeKind::Qualified:
                case TypeKind::Tag:
                case TypeKind::TypedefName:
                    break;

                case TypeKind::Error:
                    PSY_ASSERT_1(false);
                    return Action::Quit;
            }
            auto funcTy = makeType<FunctionType>(ty);
            pushType(funcTy);
            pendingFuncTys_.push(funcTy);

            VISIT(node->innerDeclarator());
            VISIT(node->attributes_PostDeclarator());
            VISIT(node->initializer());
            pushNewScope(node, ScopeKind::FunctionPrototype, true);
            VISIT(node->suffix());
            popAndStashScope();

            pendingFuncTys_.pop();
            return Action::Skip;
        }

        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }
}